

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gd_bmp.c
# Opt level: O0

int bmp_read_direct(gdImagePtr im,gdIOCtxPtr infile,bmp_info_t *info,bmp_hdr_t *header)

{
  int iVar1;
  long lVar2;
  short local_52;
  int local_50;
  int iStack_4c;
  short data;
  int blue;
  int green;
  int red;
  int alpha;
  int padding;
  int row;
  int xpos;
  int ypos;
  bmp_hdr_t *header_local;
  bmp_info_t *info_local;
  gdIOCtxPtr infile_local;
  gdImagePtr im_local;
  
  row = 0;
  padding = 0;
  alpha = 0;
  red = 0;
  green = 0;
  blue = 0;
  iStack_4c = 0;
  local_50 = 0;
  local_52 = 0;
  switch(info->enctype) {
  case 0:
    break;
  case 1:
    if (info->depth != 8) {
      return 1;
    }
    break;
  case 2:
    if (info->depth != 4) {
      return 1;
    }
    break;
  case 3:
    if (info->depth == 0x18) {
      return 1;
    }
    return 1;
  case 4:
  case 5:
  default:
    return 1;
  }
  _xpos = header;
  header_local = (bmp_hdr_t *)info;
  info_local = (bmp_info_t *)infile;
  infile_local = (gdIOCtxPtr)im;
  lVar2 = gdTell(infile);
  if (lVar2 != _xpos->off) {
    gdSeek((gdIOCtx *)info_local,_xpos->off);
  }
  red = (((int)(short)header_local[1].size / 8) * *(int *)&header_local->reserved1) % 4;
  if (red != 0) {
    red = 4 - red;
  }
  row = 0;
  do {
    if (header_local->off <= row) {
      return 0;
    }
    if ((char)header_local[1].magic == '\0') {
      alpha = (header_local->off - row) + -1;
    }
    else {
      alpha = row;
    }
    for (padding = 0; iVar1._0_2_ = header_local->reserved1, iVar1._2_2_ = header_local->reserved2,
        padding < iVar1; padding = padding + 1) {
      if ((short)header_local[1].size == 0x10) {
        iVar1 = gdGetWordLSB(&local_52,(gdIOCtx *)info_local);
        if (iVar1 == 0) {
          return 1;
        }
        blue = ((int)((int)local_52 & 0x7c00U) >> 10) << 3;
        iStack_4c = ((int)((int)local_52 & 0x3e0U) >> 5) << 3;
        local_50 = ((int)local_52 & 0x1fU) << 3;
      }
      else if ((short)header_local[1].size == 0x18) {
        iVar1 = gdGetByte(&local_50,(gdIOCtx *)info_local);
        if (((iVar1 == 0) ||
            (iVar1 = gdGetByte(&stack0xffffffffffffffb4,(gdIOCtx *)info_local), iVar1 == 0)) ||
           (iVar1 = gdGetByte(&blue,(gdIOCtx *)info_local), iVar1 == 0)) {
          return 1;
        }
      }
      else {
        iVar1 = gdGetByte(&local_50,(gdIOCtx *)info_local);
        if ((((iVar1 == 0) ||
             (iVar1 = gdGetByte(&stack0xffffffffffffffb4,(gdIOCtx *)info_local), iVar1 == 0)) ||
            (iVar1 = gdGetByte(&blue,(gdIOCtx *)info_local), iVar1 == 0)) ||
           (iVar1 = gdGetByte(&green,(gdIOCtx *)info_local), iVar1 == 0)) {
          return 1;
        }
      }
      gdImageSetPixel((gdImagePtr)infile_local,padding,alpha,
                      blue * 0x10000 + iStack_4c * 0x100 + local_50);
    }
    for (padding = red; 0 < padding; padding = padding + -1) {
      iVar1 = gdGetByte(&blue,(gdIOCtx *)info_local);
      if (iVar1 == 0) {
        return 1;
      }
    }
    row = row + 1;
  } while( true );
}

Assistant:

static int bmp_read_direct(gdImagePtr im, gdIOCtxPtr infile, bmp_info_t *info, bmp_hdr_t *header)
{
	int ypos = 0, xpos = 0, row = 0;
	int padding = 0, alpha = 0, red = 0, green = 0, blue = 0;
	signed short int data = 0;

	switch(info->enctype) {
	case BMP_BI_RGB:
		/* no-op */
		break;

	case BMP_BI_BITFIELDS:
		if (info->depth == 24) {
			BMP_DEBUG(printf("Bitfield compression isn't supported for 24-bit\n"));
			return 1;
		}
		BMP_DEBUG(printf("Currently no bitfield support\n"));
		return 1;
		break;

	case BMP_BI_RLE8:
		if (info->depth != 8) {
			BMP_DEBUG(printf("RLE is only valid for 8-bit images\n"));
			return 1;
		}
		break;
	case BMP_BI_RLE4:
		if (info->depth != 4) {
			BMP_DEBUG(printf("RLE is only valid for 4-bit images\n"));
			return 1;
		}
		break;
	case BMP_BI_JPEG:
	case BMP_BI_PNG:
	default:
		BMP_DEBUG(printf("Unsupported BMP compression format\n"));
		return 1;
	}

	/* There is a chance the data isn't until later, would be wierd but it is possible */
	if (gdTell(infile) != header->off) {
		/* Should make sure we don't seek past the file size */
		gdSeek(infile, header->off);
	}

	/* The line must be divisible by 4, else its padded with NULLs */
	padding = ((int)(info->depth / 8) * info->width) % 4;
	if (padding) {
		padding = 4 - padding;
	}


	for (ypos = 0; ypos < info->height; ++ypos) {
		if (info->topdown) {
			row = ypos;
		} else {
			row = info->height - ypos - 1;
		}

		for (xpos = 0; xpos < info->width; xpos++) {
			if (info->depth == 16) {
				if (!gdGetWordLSB(&data, infile)) {
					return 1;
				}
				BMP_DEBUG(printf("Data: %X\n", data));
				red = ((data & 0x7C00) >> 10) << 3;
				green = ((data & 0x3E0) >> 5) << 3;
				blue = (data & 0x1F) << 3;
				BMP_DEBUG(printf("R: %d, G: %d, B: %d\n", red, green, blue));
			} else if (info->depth == 24) {
				if (!gdGetByte(&blue, infile) || !gdGetByte(&green, infile) || !gdGetByte(&red, infile)) {
					return 1;
				}
			} else {
				if (!gdGetByte(&blue, infile) || !gdGetByte(&green, infile) || !gdGetByte(&red, infile) || !gdGetByte(&alpha, infile)) {
					return 1;
				}
			}
			/*alpha = gdAlphaMax - (alpha >> 1);*/
			gdImageSetPixel(im, xpos, row, gdTrueColor(red, green, blue));
		}
		for (xpos = padding; xpos > 0; --xpos) {
			if (!gdGetByte(&red, infile)) {
				return 1;
			}
		}
	}

	return 0;
}